

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall VSlider::on_mouse_button_hold(VSlider *this,int mx,int my)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  uint in_EDX;
  Widget *in_RDI;
  double r;
  double local_28;
  double local_20;
  double local_18;
  uint local_10;
  
  local_10 = in_EDX;
  uVar2 = (*in_RDI->_vptr_Widget[0x10])();
  if ((uVar2 & 1) == 0) {
    iVar1 = in_RDI->y2;
    uVar2 = Widget::height(in_RDI);
    local_18 = (double)(int)(~local_10 + iVar1) / (double)(uVar2 - 2);
    local_20 = 0.0;
    local_28 = 1.0;
    pdVar3 = std::min<double>(&local_18,&local_28);
    pdVar3 = std::max<double>(&local_20,pdVar3);
    local_18 = *pdVar3;
    *(int *)&in_RDI->field_0x34 = (int)(local_18 * (double)*(int *)&in_RDI[1]._vptr_Widget);
    Dialog::request_draw(in_RDI->dialog);
  }
  return;
}

Assistant:

void VSlider::on_mouse_button_hold(int mx, int my)
{
   if (is_disabled())
      return;

   double r = (double) (this->y2 - 1 - my) / (this->height() - 2);
   r = CLAMP(0.0, r, 1.0);
   cur_value = (int) (r * max_value);
   dialog->request_draw();

   (void)mx;
}